

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

bool __thiscall QCoreApplicationPrivate::canQuitAutomatically(QCoreApplicationPrivate *this)

{
  int iVar1;
  long in_RDI;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x91) & 1) == 0) {
    local_1 = false;
  }
  else {
    iVar1 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x3411e3);
    if (iVar1 == 0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool QCoreApplicationPrivate::canQuitAutomatically()
{
    if (!in_exec)
        return false;

    // The automatic quit functionality is triggered by
    // both QEventLoopLocker and maybeLastWindowClosed.
    // In either case, we don't want to quit if there
    // are active QEventLoopLockers, even if quitLockEnabled
    // is not enabled, as the property signals whether to
    // trigger the automatic quit, not whether to block it.
    if (quitLockRef.loadRelaxed())
        return false;

    return true;
}